

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O2

base_learner * cbifyldf_setup(options_i *options,vw *all)

{
  int iVar1;
  option_group_definition *poVar2;
  typed_option<float> *ptVar3;
  uint64_t uVar4;
  base_learner *l;
  multi_learner *base;
  learner<cbify,_std::vector<example_*,_std::allocator<example_*>_>_> *plVar5;
  long lVar6;
  undefined **ppuVar7;
  label_parser *plVar8;
  byte bVar9;
  float fVar10;
  float fVar11;
  bool cbify_ldf_option;
  allocator local_41e;
  allocator local_41d;
  allocator local_41c;
  allocator local_41b;
  allocator local_41a;
  allocator local_419;
  free_ptr<cbify> data;
  string local_408 [32];
  typed_option<float> local_3e8;
  string local_348 [32];
  string local_328;
  string local_308 [32];
  string local_2e8;
  string local_2c8;
  string local_2a8;
  stringstream ss;
  undefined1 local_278 [32];
  string local_258 [64];
  bool local_218;
  option_group_definition new_options;
  typed_option<float> local_c8;
  
  bVar9 = 0;
  scoped_calloc_or_throw<cbify>();
  cbify_ldf_option = false;
  std::__cxx11::string::string
            ((string *)&local_2a8,"Make csoaa_ldf into Contextual Bandit",(allocator *)&ss);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::string((string *)&local_2c8,"cbify_ldf",&local_419);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)&ss,&local_2c8,&cbify_ldf_option);
  local_218 = true;
  std::__cxx11::string::string
            (local_408,"Convert csoaa_ldf into a contextual bandit problem",&local_41a);
  std::__cxx11::string::_M_assign(local_258);
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (&new_options,(typed_option<bool> *)&ss);
  std::__cxx11::string::string((string *)&local_2e8,"loss0",&local_41b);
  VW::config::typed_option<float>::typed_option
            (&local_3e8,&local_2e8,
             &(data._M_t.super___uniq_ptr_impl<cbify,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_cbify_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_cbify_*,_false>._M_head_impl)->loss0);
  ptVar3 = VW::config::typed_option<float>::default_value(&local_3e8,0.0);
  std::__cxx11::string::string(local_308,"loss for correct label",&local_41c);
  std::__cxx11::string::_M_assign((string *)&(ptVar3->super_base_option).m_help);
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar2,ptVar3)
  ;
  std::__cxx11::string::string((string *)&local_328,"loss1",&local_41d);
  VW::config::typed_option<float>::typed_option
            (&local_c8,&local_328,
             &(data._M_t.super___uniq_ptr_impl<cbify,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_cbify_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_cbify_*,_false>._M_head_impl)->loss1);
  ptVar3 = VW::config::typed_option<float>::default_value(&local_c8,1.0);
  std::__cxx11::string::string(local_348,"loss for incorrect label",&local_41e);
  std::__cxx11::string::_M_assign((string *)&(ptVar3->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar2,ptVar3);
  std::__cxx11::string::~string(local_348);
  VW::config::typed_option<float>::~typed_option(&local_c8);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string(local_308);
  VW::config::typed_option<float>::~typed_option(&local_3e8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string(local_408);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)&ss);
  std::__cxx11::string::~string((string *)&local_2c8);
  (**options->_vptr_options_i)(options,&new_options);
  std::__cxx11::string::string((string *)&ss,"cbify_ldf",(allocator *)&local_3e8);
  iVar1 = (*options->_vptr_options_i[1])(options,&ss);
  std::__cxx11::string::~string((string *)&ss);
  if ((char)iVar1 == '\0') {
    plVar5 = (learner<cbify,_std::vector<example_*,_std::allocator<example_*>_>_> *)0x0;
  }
  else {
    uVar4 = uniform_hash("vw",2,0);
    (data._M_t.super___uniq_ptr_impl<cbify,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_cbify_*,_void_(*)(void_*)>.super__Head_base<0UL,_cbify_*,_false>.
    _M_head_impl)->app_seed = uVar4;
    (data._M_t.super___uniq_ptr_impl<cbify,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_cbify_*,_void_(*)(void_*)>.super__Head_base<0UL,_cbify_*,_false>.
    _M_head_impl)->all = all;
    (data._M_t.super___uniq_ptr_impl<cbify,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_cbify_*,_void_(*)(void_*)>.super__Head_base<0UL,_cbify_*,_false>.
    _M_head_impl)->use_adf = true;
    std::__cxx11::string::string((string *)&ss,"cb_explore_adf",(allocator *)&local_3e8);
    iVar1 = (*options->_vptr_options_i[1])(options,&ss);
    std::__cxx11::string::~string((string *)&ss);
    if ((char)iVar1 == '\0') {
      std::__cxx11::string::string((string *)&ss,"cb_explore_adf",(allocator *)&local_c8);
      std::__cxx11::string::string((string *)&local_3e8,"",(allocator *)local_408);
      (*options->_vptr_options_i[5])(options,&ss,&local_3e8);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::__cxx11::string::~string((string *)&ss);
    }
    std::__cxx11::string::string((string *)&ss,"cb_min_cost",(allocator *)&local_c8);
    std::__cxx11::to_string
              ((string *)&local_3e8,
               (data._M_t.super___uniq_ptr_impl<cbify,_void_(*)(void_*)>._M_t.
                super__Tuple_impl<0UL,_cbify_*,_void_(*)(void_*)>.
                super__Head_base<0UL,_cbify_*,_false>._M_head_impl)->loss0);
    (*options->_vptr_options_i[5])(options,&ss,&local_3e8);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&ss);
    std::__cxx11::string::string((string *)&ss,"cb_max_cost",(allocator *)&local_c8);
    std::__cxx11::to_string
              ((string *)&local_3e8,
               (data._M_t.super___uniq_ptr_impl<cbify,_void_(*)(void_*)>._M_t.
                super__Tuple_impl<0UL,_cbify_*,_void_(*)(void_*)>.
                super__Head_base<0UL,_cbify_*,_false>._M_head_impl)->loss1);
    (*options->_vptr_options_i[5])(options,&ss,&local_3e8);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&ss);
    std::__cxx11::string::string((string *)&ss,"baseline",(allocator *)&local_3e8);
    iVar1 = (*options->_vptr_options_i[1])(options,&ss);
    std::__cxx11::string::~string((string *)&ss);
    if ((char)iVar1 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      fVar11 = ABS((data._M_t.super___uniq_ptr_impl<cbify,_void_(*)(void_*)>._M_t.
                    super__Tuple_impl<0UL,_cbify_*,_void_(*)(void_*)>.
                    super__Head_base<0UL,_cbify_*,_false>._M_head_impl)->loss0);
      fVar10 = ABS((data._M_t.super___uniq_ptr_impl<cbify,_void_(*)(void_*)>._M_t.
                    super__Tuple_impl<0UL,_cbify_*,_void_(*)(void_*)>.
                    super__Head_base<0UL,_cbify_*,_false>._M_head_impl)->loss1);
      if (fVar10 <= fVar11) {
        fVar10 = fVar11;
      }
      std::ostream::operator<<
                (local_278,
                 fVar10 / ((data._M_t.super___uniq_ptr_impl<cbify,_void_(*)(void_*)>._M_t.
                            super__Tuple_impl<0UL,_cbify_*,_void_(*)(void_*)>.
                            super__Head_base<0UL,_cbify_*,_false>._M_head_impl)->loss1 -
                          (data._M_t.super___uniq_ptr_impl<cbify,_void_(*)(void_*)>._M_t.
                           super__Tuple_impl<0UL,_cbify_*,_void_(*)(void_*)>.
                           super__Head_base<0UL,_cbify_*,_false>._M_head_impl)->loss0));
      std::__cxx11::string::string((string *)&local_3e8,"lr_multiplier",(allocator *)local_408);
      std::__cxx11::stringbuf::str();
      (*options->_vptr_options_i[5])(options,&local_3e8,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    }
    l = setup_base(options,all);
    base = LEARNER::as_multiline<char,char>(l);
    plVar5 = LEARNER::learner<cbify,std::vector<example*,std::allocator<example*>>>::
             init_learner<LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                       (data._M_t.super___uniq_ptr_impl<cbify,_void_(*)(void_*)>._M_t.
                        super__Tuple_impl<0UL,_cbify_*,_void_(*)(void_*)>.
                        super__Head_base<0UL,_cbify_*,_false>._M_head_impl,base,
                        do_actual_learning_ldf<true>,do_actual_learning_ldf<false>,1,multiclass);
    data._M_t.super___uniq_ptr_impl<cbify,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_cbify_*,_void_(*)(void_*)>.super__Head_base<0UL,_cbify_*,_false>.
    _M_head_impl = (cbify *)0x0;
    *(undefined8 *)(plVar5 + 0xb8) = *(undefined8 *)(plVar5 + 0x18);
    *(undefined8 *)(plVar5 + 0xc0) = *(undefined8 *)(plVar5 + 0x20);
    *(code **)(plVar5 + 200) = finish;
    *(undefined8 *)(plVar5 + 0x58) = *(undefined8 *)(plVar5 + 0x18);
    *(code **)(plVar5 + 0x68) = finish_multiline_example;
    ppuVar7 = &COST_SENSITIVE::cs_label;
    plVar8 = &all->p->lp;
    for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
      plVar8->default_label = (_func_void_void_ptr *)*ppuVar7;
      ppuVar7 = ppuVar7 + (ulong)bVar9 * -2 + 1;
      plVar8 = (label_parser *)((long)plVar8 + (ulong)bVar9 * -0x10 + 8);
    }
    all->delete_prediction = (_func_void_void_ptr *)0x0;
  }
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::unique_ptr<cbify,_void_(*)(void_*)>::~unique_ptr(&data);
  return (base_learner *)plVar5;
}

Assistant:

base_learner* cbifyldf_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<cbify>();
  bool cbify_ldf_option = false;

  option_group_definition new_options("Make csoaa_ldf into Contextual Bandit");
  new_options
      .add(make_option("cbify_ldf", cbify_ldf_option).keep().help("Convert csoaa_ldf into a contextual bandit problem"))
      .add(make_option("loss0", data->loss0).default_value(0.f).help("loss for correct label"))
      .add(make_option("loss1", data->loss1).default_value(1.f).help("loss for incorrect label"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("cbify_ldf"))
    return nullptr;

  data->app_seed = uniform_hash("vw", 2, 0);
  data->all = &all;
  data->use_adf=true;

  if (!options.was_supplied("cb_explore_adf"))
  {
    options.insert("cb_explore_adf", "");
  }
  options.insert("cb_min_cost", to_string(data->loss0));
  options.insert("cb_max_cost", to_string(data->loss1));

  if (options.was_supplied("baseline"))
  {
    stringstream ss;
    ss << max<float>(abs(data->loss0), abs(data->loss1)) / (data->loss1 - data->loss0);
    options.insert("lr_multiplier", ss.str());
  }

  multi_learner* base = as_multiline(setup_base(options, all));
  learner<cbify,multi_ex>& l = init_learner(data, base, do_actual_learning_ldf<true>, do_actual_learning_ldf<false>, 1, prediction_type::multiclass);

  l.set_finish(finish);
  l.set_finish_example(finish_multiline_example);
  all.p->lp = COST_SENSITIVE::cs_label;
  all.delete_prediction = nullptr;

  return make_base(l);
}